

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O3

bool dg::llvmdg::anon_unknown_2::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  op_iterator pUVar5;
  long *plVar6;
  CallInst *pCVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  
  pUVar5 = llvm::CallBase::arg_end((CallBase *)CI);
  iVar1 = *(int *)(CI + 0x14);
  if ((((ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff) <
       *(ulong *)(F + 0x60)) ||
     ((cVar4 = llvm::Type::canLosslesslyBitCastTo
                         ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10)), cVar4 == '\0' &&
      (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) != 0xd ||
       ((*(uint *)(*(long *)CI + 8) & 0xfd) != 0xd)))))) {
LAB_00110d5f:
    bVar3 = false;
  }
  else {
    if (((byte)F[0x12] & 1) == 0) {
      plVar8 = *(long **)(F + 0x58);
      plVar6 = plVar8;
    }
    else {
      llvm::Function::BuildLazyArguments();
      plVar8 = *(long **)(F + 0x58);
      plVar6 = plVar8;
      if (((byte)F[0x12] & 1) != 0) {
        llvm::Function::BuildLazyArguments();
        plVar6 = *(long **)(F + 0x58);
      }
    }
    bVar3 = true;
    uVar11 = (ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    if ((uVar11 != 0) && (lVar2 = *(long *)(F + 0x60), plVar8 != plVar6 + lVar2 * 5)) {
      uVar10 = 1;
      pCVar7 = CI;
      do {
        plVar9 = plVar8 + 5;
        if ((((*(uint *)((Type *)**(undefined8 **)
                                   (pCVar7 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5)) + 8) & 0xfd)
              != 0xd) || ((*(uint *)(*plVar8 + 8) & 0xfd) != 0xd)) &&
           (cVar4 = llvm::Type::canLosslesslyBitCastTo
                              ((Type *)**(undefined8 **)
                                         (pCVar7 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))),
           cVar4 == '\0')) goto LAB_00110d5f;
        if (uVar11 <= uVar10) break;
        pCVar7 = pCVar7 + 0x20;
        uVar10 = uVar10 + 1;
        plVar8 = plVar9;
      } while (plVar9 != plVar6 + lVar2 * 5);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

inline bool
callIsCompatible(const llvm::Function *F, const llvm::CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

#if LLVM_VERSION_MAJOR >= 8
    auto max_idx = CI->arg_size();
#else
    auto max_idx = CI->getNumArgOperands();
#endif

    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > max_idx) {
                return false;
            }
        } else if (F->arg_size() != max_idx) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > max_idx) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < max_idx && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}